

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O3

string * str_concat(string *__return_storage_ptr__,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *vs,string *separator)

{
  pointer pbVar1;
  pointer pcVar2;
  pointer pbVar3;
  
  pbVar3 = (vs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (vs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pbVar3 == pbVar1) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    pcVar2 = (pbVar3->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + pbVar3->_M_string_length);
    pbVar3 = (vs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    while (pbVar3 = pbVar3 + 1,
          pbVar3 != (vs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(separator->_M_dataplus)._M_p);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(pbVar3->_M_dataplus)._M_p);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string str_concat (const std::vector<std::string>& vs, const std::string& separator)
{
    // empty? return empty string
    if (vs.empty()) return "";
    
    // put together the return string, start with the first element
    std::string s = vs.front();
    for (auto iter = std::next(vs.begin()); iter != vs.end(); ++iter)
    {
        s += separator;
        s += *iter;
    }
    return s;
}